

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

IndexPair __thiscall
slang::IntervalMap<unsigned_long,std::monostate,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>,true>
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint32_t count;
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,std::monostate,11u> *this_00;
  interval<unsigned_long> *piVar1;
  ulong uVar2;
  NodeRef *pNVar3;
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *in_RSI;
  BranchNode<unsigned_long,_8U,_true> *in_RDI;
  uint32_t i_1;
  uint32_t size;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *newNode;
  uint32_t i;
  NodeRef nodes [2];
  uint32_t pos;
  uint32_t sizes [2];
  uint32_t NumNodes;
  IndexPair newOffset;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *in_stack_ffffffffffffff58;
  PoolAllocator<char,_192UL,_64UL> *this_01;
  undefined8 in_stack_ffffffffffffff70;
  PoolAllocator<char,_192UL,_64UL> *this_02;
  uint32_t *in_stack_ffffffffffffff78;
  PoolAllocator<char,_192UL,_64UL> *pPVar4;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
  *this_03;
  interval<unsigned_long> in_stack_ffffffffffffff80;
  uint local_6c;
  BumpAllocator *local_68;
  uint local_4c;
  PoolAllocator<char,_192UL,_64UL> local_48;
  PoolAllocator<char,_192UL,_64UL> local_38 [2];
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *local_18;
  IndexPair local_8;
  
  local_38[0].freeList._4_4_ = 2;
  local_18 = in_RSI;
  local_8 = IntervalMapDetails::distribute
                      (in_stack_ffffffffffffff80.right._4_4_,
                       (uint32_t)in_stack_ffffffffffffff80.right,
                       in_stack_ffffffffffffff80.left._4_4_,in_stack_ffffffffffffff78,
                       (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  local_38[0].alloc._0_4_ = 0;
  this_02 = local_38;
  pPVar4 = &local_48;
  do {
    this_01 = pPVar4;
    IntervalMapDetails::NodeRef::NodeRef((NodeRef *)0xbe2122);
    pPVar4 = (PoolAllocator<char,_192UL,_64UL> *)&this_01->freeList;
  } while (pPVar4 != this_02);
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    this_00 = (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,std::monostate,11u> *)
              PoolAllocator<char,192ul,64ul>::
              emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                        (this_02);
    count = *(uint32_t *)((long)&local_38[0].alloc + (ulong)local_4c * 4 + 4);
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,std::monostate,11u>::copy<11u>
              (this_00,local_18,(uint32_t)local_38[0].alloc,0,count);
    IntervalMapDetails::NodeRef::
    NodeRef<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
              ((NodeRef *)this_01,in_stack_ffffffffffffff58,0);
    (&local_48.alloc)[local_4c] = local_68;
    local_38[0].alloc._0_4_ = count + (uint32_t)local_38[0].alloc;
  }
  memset(in_RDI,0,0xc0);
  IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::BranchNode
            ((BranchNode<unsigned_long,_8U,_true> *)0xbe21d9);
  for (local_6c = 0;
      this_03 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                 *)in_stack_ffffffffffffff80.left, local_6c < 2; local_6c = local_6c + 1) {
    IntervalMapDetails::NodeRef::
    get<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
              ((NodeRef *)this_01);
    in_stack_ffffffffffffff80 =
         IntervalMapDetails::
         NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
         ::getBounds(this_03,(uint32_t)((ulong)pPVar4 >> 0x20));
    piVar1 = IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::keyAt(in_RDI,local_6c);
    piVar1->left = in_stack_ffffffffffffff80.left;
    piVar1->right = in_stack_ffffffffffffff80.right;
    uVar2 = (ulong)local_6c;
    pNVar3 = IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::childAt(in_RDI,local_6c);
    (pNVar3->pip).value = (uintptr_t)(&local_48.alloc)[uVar2];
  }
  *(undefined4 *)
   ((long)&in_RDI[1].
           super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
           .first[0].pip.value + 4) = 2;
  *(int *)&in_RDI[1].
           super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
           .first[0].pip.value =
       (int)in_RDI[1].
            super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<unsigned_long>,_8U>
            .first[0].pip.value + 1;
  return local_8;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}